

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definitions.cpp
# Opt level: O3

void __thiscall dg::dda::Definitions::join(Definitions *this,Definitions *rhs)

{
  _Hash_node_base *p_Var1;
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_58;
  
  p_Var1 = (rhs->definitions)._definitions._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      DefinitionsMap<dg::dda::RWNode>::add
                (&this->definitions,(RWNode *)p_Var1[1]._M_nxt,(OffsetsT *)(p_Var1 + 2));
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  DefinitionsMap<dg::dda::RWNode>::intersect
            ((DefinitionsMap<dg::dda::RWNode> *)&_Stack_58,&this->kills,&rhs->kills);
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&this->kills,&_Stack_58);
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&_Stack_58);
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>>
            ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&this->unknownWrites,
             (this->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (rhs->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (rhs->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void Definitions::join(const Definitions &rhs) {
    definitions.add(rhs.definitions);
    kills = kills.intersect(rhs.kills);
    unknownWrites.insert(unknownWrites.end(), rhs.unknownWrites.begin(),
                         rhs.unknownWrites.end());
}